

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::Relation::ExecuteOrThrow(Relation *this)

{
  pointer pQVar1;
  pointer *__ptr;
  string local_38;
  
  Execute(this);
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)this);
  if ((pQVar1->super_BaseQueryResult).success != false) {
    return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
           (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
  }
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)this);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,anon_var_dwarf_4f001a4 + 9);
  BaseQueryResult::ThrowError(&pQVar1->super_BaseQueryResult,&local_38);
}

Assistant:

unique_ptr<QueryResult> Relation::ExecuteOrThrow() {
	auto res = Execute();
	D_ASSERT(res);
	if (res->HasError()) {
		res->ThrowError();
	}
	return res;
}